

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O3

bool __thiscall
flatbuffers::rust::RustGenerator::TableBuilderArgsNeedsLifetime
          (RustGenerator *this,StructDef *struct_def)

{
  FullType FVar1;
  pointer ppFVar2;
  
  if (struct_def->fixed == true) {
    __assert_fail("!struct_def.fixed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp"
                  ,0x212,
                  "bool flatbuffers::rust::RustGenerator::TableBuilderArgsNeedsLifetime(const StructDef &) const"
                 );
  }
  ppFVar2 = (struct_def->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppFVar2 !=
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      if ((*ppFVar2)->deprecated == false) {
        FVar1 = anon_unknown_26::GetFullType(&((*ppFVar2)->value).type);
        if (ftUnionValue < FVar1) {
          return true;
        }
        if ((0xe7U >> (FVar1 & (ftVectorOfUnionValue|ftVectorOfString)) & 1) == 0) {
          return true;
        }
      }
      ppFVar2 = ppFVar2 + 1;
    } while (ppFVar2 !=
             (struct_def->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  return false;
}

Assistant:

bool TableBuilderArgsNeedsLifetime(const StructDef &struct_def) const {
    FLATBUFFERS_ASSERT(!struct_def.fixed);

    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      const auto &field = **it;
      if (field.deprecated) { continue; }

      if (TableBuilderTypeNeedsLifetime(field.value.type)) { return true; }
    }

    return false;
  }